

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

RayDifferential * __thiscall
pbrt::Interaction::SpawnRay(RayDifferential *__return_storage_ptr__,Interaction *this,Vector3f *d)

{
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [32];
  Point3f PVar8;
  
  PVar8 = OffsetRayOrigin(this,d);
  fVar5 = (d->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar6 = (d->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar1 = (d->super_Tuple3<pbrt::Vector3,_float>).z;
  FVar2 = this->time;
  GetMedium((Interaction *)&(__return_storage_ptr__->super_Ray).medium,(Vector3f *)this);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  uVar3 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar8.super_Tuple3<pbrt::Point3,_float>.z;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = fVar5;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = fVar6;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  (__return_storage_ptr__->super_Ray).time = FVar2;
  __return_storage_ptr__->hasDifferentials = false;
  auVar7 = ZEXT1232(ZEXT812(0));
  __return_storage_ptr__->rxOrigin = (Point3f)auVar7._0_12_;
  __return_storage_ptr__->ryOrigin = (Point3f)auVar7._12_12_;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar7._24_4_;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar7._28_4_;
  *(undefined1 (*) [32])&(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       auVar7;
  return __return_storage_ptr__;
}

Assistant:

SpawnRay(const Vector3f &d) const {
        return RayDifferential(OffsetRayOrigin(d), d, time, GetMedium(d));
    }